

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zinf_norm_error(int nrhs,SuperMatrix *X,doublecomplex *xtrue)

{
  int *piVar1;
  long lVar2;
  double dVar3;
  doublecomplex *local_80;
  double local_70;
  int local_60;
  int local_5c;
  int j;
  int i;
  doublecomplex temp;
  doublecomplex *soln_work;
  doublecomplex *Xmat;
  double xnorm;
  double err;
  DNformat *Xstore;
  doublecomplex *xtrue_local;
  SuperMatrix *X_local;
  int nrhs_local;
  
  piVar1 = (int *)X->Store;
  lVar2 = *(long *)(piVar1 + 2);
  for (local_60 = 0; local_60 < nrhs; local_60 = local_60 + 1) {
    temp.i = (double)(lVar2 + (long)(local_60 * *piVar1) * 0x10);
    Xmat = (doublecomplex *)0x0;
    xnorm = 0.0;
    for (local_5c = 0; local_5c < X->nrow; local_5c = local_5c + 1) {
      _j = *(double *)((long)temp.i + (long)local_5c * 0x10) - xtrue[local_5c].r;
      temp.r = *(double *)((long)temp.i + (long)local_5c * 0x10 + 8) - xtrue[local_5c].i;
      dVar3 = z_abs((doublecomplex *)&j);
      if (xnorm <= dVar3) {
        local_70 = z_abs((doublecomplex *)&j);
      }
      else {
        local_70 = xnorm;
      }
      xnorm = local_70;
      dVar3 = z_abs((doublecomplex *)((long)temp.i + (long)local_5c * 0x10));
      if ((double)Xmat <= dVar3) {
        local_80 = (doublecomplex *)z_abs((doublecomplex *)((long)temp.i + (long)local_5c * 0x10));
      }
      else {
        local_80 = Xmat;
      }
      Xmat = local_80;
    }
    printf("||X - Xtrue||/||X|| = %e\n",xnorm / (double)Xmat);
  }
  return;
}

Assistant:

void zinf_norm_error(int nrhs, SuperMatrix *X, doublecomplex *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    doublecomplex *Xmat, *soln_work;
    doublecomplex temp;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
        z_sub(&temp, &soln_work[i], &xtrue[i]);
	err = SUPERLU_MAX(err, z_abs(&temp));
	xnorm = SUPERLU_MAX(xnorm, z_abs(&soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}